

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  TValue TVar1;
  ulong uVar2;
  void *pvVar3;
  
  switch((ir->field_1).o) {
  case '\x16':
    uVar2 = ~((ulong)((ir->field_1).t.irt & 0x1f) << 0x2f);
    goto LAB_00156561;
  case '\x17':
    TVar1.n = (lua_Number)ir->i;
    goto LAB_001565aa;
  case '\x18':
    uVar2 = (long)(char)(~(ir->field_1).t.irt | 0xe0) << 0x2f | (ulong)ir[1];
LAB_00156561:
    tv->u64 = uVar2;
    break;
  case '\x19':
  case '\x1a':
    tv->n = ((double)CONCAT44(0x43300000,ir[1].i) - 4503599627370496.0) +
            ((double)CONCAT44(0x45300000,SUB84(ir[1].gcr,4)) - 1.9342813113834067e+25);
    break;
  case '\x1b':
    tv->u64 = 0;
    break;
  case '\x1c':
    TVar1 = *(TValue *)(ir + 1);
LAB_001565aa:
    *tv = TVar1;
    break;
  case '\x1d':
    pvVar3 = lj_mem_newgco(L,0x18);
    *(undefined1 *)((long)pvVar3 + 9) = 10;
    *(undefined2 *)((long)pvVar3 + 10) = 0xb;
    *(IRIns *)((long)pvVar3 + 0x10) = ir[1];
    tv->u64 = (ulong)pvVar3 | 0xfffa800000000000;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lj_assertL(ir->o != IR_KSLOT, "unexpected KSLOT");  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setpriV(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR:
    setnumV(tv, (lua_Number)(uintptr_t)ir_kptr(ir));
    break;
  case IR_KNULL: setintV(tv, 0); break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lj_assertL(0, "bad IR constant op %d", ir->o); break;
  }
}